

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O2

void __thiscall
xLearn::Predictor::Initialize
          (Predictor *this,Reader *reader,Model *model,Loss *loss,string *out,bool sign,bool sigmoid
          ,bool res_out)

{
  ostream *poVar1;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (reader == (Reader *)0x0) {
    local_6c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_6d);
    std::__cxx11::string::string((string *)&local_68,"Initialize",&local_6e);
    poVar1 = Logger::Start(ERR,&local_48,0x34,&local_68);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x34);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"reader");
    std::operator<<(poVar1," == NULL \n");
  }
  else if (model == (Model *)0x0) {
    local_6c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_6d);
    std::__cxx11::string::string((string *)&local_68,"Initialize",&local_6e);
    poVar1 = Logger::Start(ERR,&local_48,0x35,&local_68);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x35);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"model");
    std::operator<<(poVar1," == NULL \n");
  }
  else if (loss == (Loss *)0x0) {
    local_6c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_6d);
    std::__cxx11::string::string((string *)&local_68,"Initialize",&local_6e);
    poVar1 = Logger::Start(ERR,&local_48,0x36,&local_68);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x36);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"loss");
    std::operator<<(poVar1," == NULL \n");
  }
  else {
    if ((!res_out) || (out->_M_string_length != 0)) {
      this->reader_ = reader;
      this->model_ = model;
      this->loss_ = loss;
      std::__cxx11::string::_M_assign((string *)&this->out_file_);
      this->sign_ = sign;
      this->sigmoid_ = sigmoid;
      this->res_out_ = res_out;
      return;
    }
    local_6c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
               ,&local_6d);
    std::__cxx11::string::string((string *)&local_68,"Initialize",&local_6e);
    poVar1 = Logger::Start(ERR,&local_48,0x38,&local_68);
    poVar1 = std::operator<<(poVar1,"CHECK_NE failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/inference.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x38);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"out.empty()");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"true");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    std::operator<<(poVar1,"\n");
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void Initialize(Reader* reader,
                  Model* model,
                  Loss* loss,
                  const std::string& out,
                  bool sign = false,
                  bool sigmoid = false,
                  bool res_out = true) {
    CHECK_NOTNULL(reader);
    CHECK_NOTNULL(model);
    CHECK_NOTNULL(loss);
    if (res_out)
      CHECK_NE(out.empty(), true);
    reader_ = reader;
    model_ = model;
    loss_ = loss;
    out_file_ = out;
    sign_ = sign;
    sigmoid_ = sigmoid;
    res_out_ = res_out;
  }